

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Mix_Generic_SSE2
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint32_t uVar8;
  long lVar9;
  float fVar10;
  
  if (toMix != 0) {
    uVar3 = (ulong)srcChans;
    uVar8 = 0;
    do {
      if (dstChans != 0) {
        lVar9 = 0;
        uVar5 = 0;
        do {
          uVar7 = 0;
          if (3 < srcChans) {
            fVar10 = dst[uVar5];
            lVar6 = 0;
            uVar4 = srcChans;
            do {
              pfVar1 = coefficients + (uint)((int)lVar9 + (int)lVar6);
              pfVar2 = src + lVar6;
              fVar10 = fVar10 + pfVar2[3] * pfVar1[3] + pfVar2[2] * pfVar1[2] +
                                pfVar2[1] * pfVar1[1] + *pfVar2 * *pfVar1;
              lVar6 = lVar6 + 4;
              uVar4 = uVar4 - 4;
            } while (3 < uVar4);
            dst[uVar5] = fVar10;
            uVar7 = (ulong)(srcChans & 0xfffffffc);
          }
          if ((uint)uVar7 < srcChans) {
            fVar10 = dst[uVar5];
            do {
              fVar10 = fVar10 + src[uVar7] * coefficients[(uint)((int)lVar9 + (int)uVar7)];
              uVar7 = uVar7 + 1;
            } while (uVar3 != uVar7);
            dst[uVar5] = fVar10;
          }
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + uVar3;
        } while (uVar5 != dstChans);
      }
      uVar8 = uVar8 + 1;
      dst = dst + dstChans;
      src = src + uVar3;
    } while (uVar8 != toMix);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_SSE2(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; srcChans - ci >= 4; ci += 4)
		{
			/* do SIMD */
			const __m128 vols = _mm_loadu_ps(&coefficients[co * srcChans + ci]);
			const __m128 dat = _mm_loadu_ps(&src[ci]);
			dst[co] += FAudio_simd_hadd(_mm_mul_ps(dat, vols));
		}

		for (; ci < srcChans; ci += 1)
		{
			/* do scalar */
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}